

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::BoolOption::printOptionCall(BoolOption *this,stringstream *s)

{
  size_t sVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  
  poVar3 = (ostream *)(s + 0x10);
  if (this->value == true) {
    pcVar4 = "-";
    lVar2 = 1;
  }
  else {
    pcVar4 = "-no-";
    lVar2 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,lVar2);
  pcVar4 = (this->super_Option).name;
  if (pcVar4 != (char *)0x0) {
    sVar1 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar1);
    return;
  }
  std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s)
    {
        if (value) {
            s << "-" << name;
        } else {
            s << "-no-" << name;
        }
    }